

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfs.c
# Opt level: O0

Header * arcfs_read_header(FILE *ifp)

{
  Byte BVar1;
  int iVar2;
  Word WVar3;
  Word WVar4;
  Word WVar5;
  Word WVar6;
  Word WVar7;
  Word WVar8;
  Word WVar9;
  Word WVar10;
  Header *hdr;
  int local_64;
  arcfs_header paStack_60;
  int j;
  arcfs_header header_prev;
  Word info_word;
  Word complen;
  Word attr;
  Word exec;
  Word load;
  Word length;
  Byte name [12];
  Byte info_byte;
  Word i;
  Word version;
  Header *header;
  Word header_length;
  Word data_start;
  FILE *ifp_local;
  
  paStack_60 = (arcfs_header)0x0;
  if (arcfs_initialised == 0) {
    arcfs_initialised = 1;
    memset(&null_header,0,0x2c);
    null_header.comptype = '\0';
    WVar3 = read_word(ifp);
    WVar4 = read_word(ifp);
    register0x00000000 = read_word(ifp);
    if (register0x00000000 < 0x29) {
      read_word(ifp);
      register0x00000000 = read_word(ifp);
      if (register0x00000000 == 0) {
        name[5] = '\0';
        name[6] = '\0';
        name[7] = '\0';
        name[8] = '\0';
        unique0x10000293 = 0;
        for (; (uint)name._5_4_ < 0x11; name._5_4_ = name._5_4_ + 1) {
          read_word(ifp);
        }
        name[5] = '\0';
        name[6] = '\0';
        name[7] = '\0';
        name[8] = '\0';
        for (; (uint)name._5_4_ < WVar3 / 0x24; name._5_4_ = name._5_4_ + 1) {
          hdr = (Header *)malloc(0x2c);
          header_ptr = (arcfs_header)malloc(0x20);
          if ((hdr == (Header *)0x0) || (header_ptr == (arcfs_header)0x0)) {
            error("Out of memory");
            return &null_header;
          }
          name[4] = read_byte(ifp);
          for (local_64 = 0; local_64 < 0xb; local_64 = local_64 + 1) {
            BVar1 = read_byte(ifp);
            *(Byte *)((long)&load + (long)local_64 + 3) = BVar1;
            if (*(char *)((long)&load + (long)local_64 + 3) == '/') {
              *(undefined1 *)((long)&load + (long)local_64 + 3) = 0x5f;
            }
            if ((*(byte *)((long)&load + (long)local_64 + 3) < 0x20) ||
               (0x7e < *(byte *)((long)&load + (long)local_64 + 3))) {
              *(undefined1 *)((long)&load + (long)local_64 + 3) = 0;
            }
          }
          *(undefined1 *)((long)&load + (long)local_64 + 3) = 0;
          WVar5 = read_word(ifp);
          WVar6 = read_word(ifp);
          WVar7 = read_word(ifp);
          WVar8 = read_word(ifp);
          WVar9 = read_word(ifp);
          WVar10 = read_word(ifp);
          if (name[4] == '\x01') {
            free(hdr);
            free(header_ptr);
          }
          else {
            header_ptr->is_dir = (byte)(WVar10 >> 0x1f);
            header_ptr->info_byte = name[4];
            header_ptr->info_word = WVar10;
            header_ptr->maxbits = (Byte)(WVar8 >> 8);
            header_ptr->seek = (WVar10 & 0x7fffffff) + WVar4;
            hdr->comptype = name[4];
            strcpy(hdr->name,(char *)((long)&load + 3));
            hdr->complen = WVar9;
            hdr->date = 0;
            hdr->time = 0;
            hdr->crc = (Halfword)(WVar8 >> 0x10);
            hdr->origlen = WVar5;
            hdr->load = WVar6;
            hdr->exec = WVar7;
            hdr->attr = WVar8 & 0xff;
            arcfs_fixtime(hdr);
            if (name[4] == '\0') {
              memcpy(hdr,&null_header,0x2c);
              header_ptr->is_dir = '\0';
              header_ptr->seek = 0;
            }
            if (header_ptr->is_dir != '\0') {
              hdr->comptype = '\x02';
              hdr->load = 0xfffddcff;
            }
            header_ptr->header = hdr;
            if (paStack_60 == (arcfs_header)0x0) {
              header_list = header_ptr;
            }
            else {
              paStack_60->next = header_ptr;
            }
            paStack_60 = header_ptr;
          }
        }
        header_ptr = header_list;
        ifp_local = (FILE *)header_list->header;
        if ((header_list->is_dir == '\0') &&
           (iVar2 = fseek((FILE *)ifp,(ulong)header_list->seek,0), iVar2 != 0)) {
          error("Cannot seek compressed data in this file");
          return &null_header;
        }
        arcfs_maxbits = (int)header_ptr->maxbits;
        header_ptr = header_ptr->next;
      }
      else {
        error("Archive format %d not understood",(ulong)register0x00000000);
        ifp_local = (FILE *)&null_header;
      }
    }
    else {
      error("Archive created by a newer version of ArcFS (%d.%02d)",(ulong)register0x00000000 / 100,
            (ulong)register0x00000000 % 100);
      ifp_local = (FILE *)&null_header;
    }
  }
  else if (header_ptr == (arcfs_header)0x0) {
    ifp_local = (FILE *)&null_header;
  }
  else {
    ifp_local = (FILE *)header_ptr->header;
    if ((header_ptr->is_dir == '\0') &&
       (iVar2 = fseek((FILE *)ifp,(ulong)header_ptr->seek,0), iVar2 != 0)) {
      error("Cannot seek compressed data in this file");
      return &null_header;
    }
    arcfs_maxbits = (int)header_ptr->maxbits;
    header_ptr = header_ptr->next;
  }
  return (Header *)ifp_local;
}

Assistant:

Header *
arcfs_read_header(FILE *ifp)
{
	Word data_start;
	Word header_length = 0;
	Header *header;
	Word version;
	Word i;
	Byte info_byte, name[12];
	Word length, load, exec, attr, complen, info_word;
	arcfs_header header_prev = NULL;
	int j;

	/* Return next header from list */
	if (arcfs_initialised)
	{
		/* If end of list return an empty header structure to indicate EOF */
		if (header_ptr == NULL)
			return (&null_header);

		/* Return next header in list */
		header = header_ptr->header;
		/* Seek to start of compressed data */
		if ((!header_ptr->is_dir)
			&& (fseek(ifp, (long) header_ptr->seek, SEEK_SET)))
		{
			error("Cannot seek compressed data in this file");
			return (&null_header);
		}
		/* Set up number of compression bits */
		arcfs_maxbits = header_ptr->maxbits;
		/*if (header_ptr->is_dir) header = &null_header; */
		header_ptr = header_ptr->next;
		return (header);
	}

	/* Header list not constructed yet, so read all headers from file */
	arcfs_initialised = 1;
	memset((char *) &null_header, '\0', sizeof(null_header));
	null_header.comptype = 0;
	header_length = read_word(ifp);
	data_start = read_word(ifp);
	if ((version = read_word(ifp)) > 40)
	{
		/* BB removed floating point routines from next line
		   This saves linking the floating point routines under DOS
		   which yields quite a reduction in executable size.
		   And it removes the need to have the FPE present under RISC OS. */
		/* error("Archive created by a newer version of ArcFS (%.2f)",((float)version)/100); */
		error("Archive created by a newer version of ArcFS (%d.%02d)",
			   version / 100, version % 100);
		return (&null_header);
	}
	read_word(ifp);				/* read/write version */
	if ((version = read_word(ifp)) > 0)
	{
		error("Archive format %d not understood", version);
		return (&null_header);
	}
	for (i = 0; i < 17; i++)
		read_word(ifp);			/* reserved */

	/* Read list of headers */
	for (i = 0; i < header_length / 36; i++)
	{
		/* Create list item */
		header = (Header *) malloc(sizeof(Header));
		header_ptr = (arcfs_header) malloc(sizeof(struct arcfs_header_s));
		if ((header == NULL) || (header_ptr == NULL))
		{
			error("Out of memory");
			return (&null_header);
		}

		/* Read ArcFS file header */
		info_byte = read_byte(ifp);
		for (j = 0; j < 11; j++)
		{
			name[j] = read_byte(ifp);
			if (name[j] == PATHSEP)
				name[j] = '_';
			if (name[j] < ' ' || name[j] > '~')
				name[j] = '\0';
		}
		name[j] = '\0';
		length = read_word(ifp);
		load = read_word(ifp);
		exec = read_word(ifp);
		attr = read_word(ifp);
		complen = read_word(ifp);
		info_word = read_word(ifp);

		/* Examine, and create nspark header */
		if (info_byte == AFS_DELETED)
		{
			free(header);
			free(header_ptr);
			continue;
		}
		/* BB changed next line for Borland C/C++ 4 */
		/* header_ptr->is_dir = (info_word >> 31); */
#ifdef __MSDOS__
		header_ptr->is_dir = (Halfword) (info_word >> 31);
#else
		header_ptr->is_dir = (info_word >> 31);
#endif
		header_ptr->info_byte = info_byte;
		header_ptr->info_word = info_word;
		/* BB changed next line for Borland C/C++ 4 */
		/* header_ptr->maxbits = (attr & 0xff00) >> 8; */
#ifdef __MSDOS__
		header_ptr->maxbits = (Halfword) (attr & 0xff00) >> 8;
#else
		header_ptr->maxbits = (attr & 0xff00) >> 8;
#endif
		/* BB changed constant in next line to long. */
		header_ptr->seek = (info_word & 0x7fffffffL) + data_start;
		header->comptype = info_byte;
		strcpy(header->name, (char *) name);
		header->complen = complen;
		header->date = 0;
		header->time = 0;
		header->crc = (Halfword) (attr >> 16);
		header->origlen = length;
		header->load = load;
		header->exec = exec;
		header->attr = attr & 0xff;

		arcfs_fixtime(header);

		if (info_byte == AFS_ENDDIR)
		{
			/* Just return comptype == 0 */
			*header = null_header;
			header_ptr->is_dir = 0;
			header_ptr->seek = 0;
		}

		/* If it is an ArcFS directory then convert to a Spark directory */
		if (header_ptr->is_dir)
		{
			/* Make sure filetype is DDC */
			header->comptype = CT_NOTCOMP2;
			/* BB changed constant in next line to long. */
			header->load = 0xfffddcffL;
		}

		/* Add list item to list */
		/* Doing it here ensures that deleted items are not added */
		header_ptr->header = header;
		if (header_prev)
			header_prev->next = header_ptr;
		else
			header_list = header_ptr;
		header_prev = header_ptr;
#ifdef DEBUGGING
		print_header(header);
#endif
	}

	/* Return first element */
	header_ptr = header_list;
	header = header_ptr->header;
	/* Seek to start of data for first element */
	if ((!header_ptr->is_dir)
		&& (fseek(ifp, (long) header_ptr->seek, SEEK_SET)))
	{
		error("Cannot seek compressed data in this file");
		return (&null_header);
	}
	/* Set up number of compression bits */
	arcfs_maxbits = header_ptr->maxbits;
	/*if (header_ptr->is_dir) header = &null_header; */
	header_ptr = header_ptr->next;
	return (header);
}